

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O1

void ON_hsort(void *base,size_t nel,size_t width,_func_int_void_ptr_void_ptr *compar)

{
  ulong uVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  undefined1 *__dest;
  ulong uVar5;
  ulong uVar6;
  void *__src;
  void *__dest_00;
  ulong uVar7;
  uchar work_memory [64];
  void *local_b8;
  undefined1 local_78 [72];
  
  if (nel < 2) {
    return;
  }
  uVar5 = nel - 1;
  if (width < 0x41) {
    __dest = local_78;
  }
  else {
    __dest = (undefined1 *)onmalloc(width);
  }
  uVar6 = nel >> 1;
  local_b8 = (void *)(uVar5 * width + (long)base);
  do {
    if (uVar6 == 0) {
      memcpy(__dest,local_b8,width);
      memcpy(local_b8,base,width);
      uVar5 = uVar5 - 1;
      if (uVar5 == 0) {
        memcpy(base,__dest,width);
        if (width < 0x41) {
          return;
        }
        onfree(__dest);
        return;
      }
      local_b8 = (void *)((long)local_b8 - width);
      uVar6 = 0;
    }
    else {
      uVar6 = uVar6 - 1;
      memcpy(__dest,(void *)(uVar6 * width + (long)base),width);
    }
    __dest_00 = (void *)(uVar6 * width + (long)base);
    if (uVar6 * 2 < uVar5) {
      uVar7 = uVar6 * 2 | 1;
      do {
        __src = (void *)(uVar7 * width + (long)base);
        if (uVar7 < uVar5) {
          uVar3 = (*compar)(__src,(void *)(width + (long)__src));
          pvVar2 = (void *)(width + (long)__src);
          if (-1 < (int)uVar3) {
            pvVar2 = __src;
          }
          __src = pvVar2;
          uVar7 = uVar7 + (uVar3 >> 0x1f);
        }
        iVar4 = (*compar)(__dest,__src);
        uVar1 = uVar5;
        if (iVar4 < 0) {
          memcpy(__dest_00,__src,width);
          __dest_00 = __src;
          uVar1 = uVar7 * 2;
        }
        uVar7 = uVar1 + 1;
      } while (uVar7 <= uVar5);
    }
    memcpy(__dest_00,__dest,width);
  } while( true );
}

Assistant:

void
ON_hsort(void *base, size_t nel, size_t width, int (*compar)(const void*,const void*))
{
  size_t
    i_end,k;
  unsigned char
    work_memory[work_size], *e_tmp, *e_end;

  if (nel < 2) return;
  k = nel >> 1;
  i_end = nel-1;
  e_end = ((unsigned char*)base) + i_end*width;
  e_tmp = (width > work_size) ? (unsigned char*)onmalloc(width) : work_memory;
  for (;;) {
    if (k) {
      --k;
      memcpy(e_tmp,((unsigned char*)base)+k*width,width); /* e_tmp = e[k]; */
    } 
    else {      
      memcpy(e_tmp,e_end,width);     /* e_tmp = e[i_end]; */
      memcpy(e_end,base,width);      /* e[i_end] = e[0];  */
      if (!(--i_end)) {
        memcpy(base,e_tmp,width);    /* e[0] = e_tmp;     */
        break;
      }
      e_end -= width;
    }
    { size_t i, j;
      unsigned char *e_i, *e_j;
      i = k;
      j = (k<<1) + 1;
      e_i = ((unsigned char*)base) + i*width;
      while (j <= i_end) {
        e_j = ((unsigned char*)base) + j*width;
        if (j < i_end && compar(e_j,e_j+width)<0 /*e[j] < e[j + 1] */)
          {j++; e_j += width;}
        if (compar(e_tmp,e_j)<0 /* e_tmp < e[j] */) {
          memcpy(e_i,e_j,width); /* e[i] = e[j]; */
          i = j;
          e_i = e_j;
          j = (j<<1) + 1;
        } else j = i_end + 1;
      }
      memcpy(e_i,e_tmp,width); /* e[i] = e_tmp; */
    }
  }
  if (width > work_size) onfree(e_tmp); 
}